

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VaryingOutputCountShader::shadePrimitives
          (VaryingOutputCountShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  VertexPacket *pVVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int ndx;
  int iVar6;
  float __x;
  float fVar7;
  float fVar8;
  Vec4 texColor;
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  undefined8 uStack_100;
  ulong local_f8;
  ulong local_f0;
  Vector<float,_4> local_e8;
  Vec4 position1;
  Vec4 position0;
  Vec4 colors [4];
  void *local_78;
  size_t sStack_70;
  void *local_68;
  size_t sStack_60;
  void *local_58;
  size_t sStack_50;
  void *local_48;
  size_t sStack_40;
  
  local_48 = (void *)0x3f800000;
  sStack_40 = 0x3f80000000000000;
  local_58 = (void *)0x3f80000000000000;
  sStack_50 = 0x3f80000000000000;
  local_68 = (void *)0x0;
  sStack_60 = 0x3f8000003f800000;
  local_78 = (void *)0x3f8000003f800000;
  sStack_70 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(colors,(Vector<float,_4> *)&local_48);
  tcu::Vector<float,_4>::Vector(colors + 1,(Vector<float,_4> *)&local_58);
  tcu::Vector<float,_4>::Vector(colors + 2,(Vector<float,_4> *)&local_68);
  tcu::Vector<float,_4>::Vector(colors + 3,(Vector<float,_4> *)&local_78);
  lVar3 = (long)invocationID;
  __x = (float)invocationID;
  uVar4 = 0;
  if (numPackets < 1) {
    numPackets = 0;
  }
  local_f8 = (ulong)(uint)numPackets;
  while (uVar4 != local_f8) {
    local_f0 = uVar4;
    pVVar1 = packets[uVar4].vertices[0];
    iVar2 = *(int *)&(this->super_ShaderProgram).field_0x154;
    if (iVar2 == 2) {
      lVar5 = lVar3;
      fVar7 = __x;
      if (this->m_instanced == false) {
        fVar8 = pVVar1->outputs[0].v.fData[0];
        fVar7 = (float)(int)fVar8;
        lVar5 = (long)(int)fVar8;
      }
      sglr::rc::Texture2D::sample((Texture2D *)&texColor,fVar7 * 0.25 + 0.125,0.5,0.0);
      iVar2 = 0;
      if (0.0 < texColor.m_data[2]) {
        iVar2 = this->m_maxEmitCount;
      }
      iVar6 = iVar2 + 6;
      if (texColor.m_data[0] <= 0.0) {
        iVar6 = iVar2;
      }
      local_118._8_8_ = *(undefined8 *)(colors[lVar5].m_data + 2);
      local_118._0_8_ = *(undefined8 *)colors[lVar5].m_data;
      iVar2 = iVar6 + 10;
      if (texColor.m_data[3] <= 0.0) {
        iVar2 = iVar6;
      }
    }
    else if (iVar2 == 1) {
      lVar5 = lVar3;
      if (this->m_instanced == false) {
        lVar5 = (long)(int)pVVar1->outputs[0].v.fData[0];
      }
      local_118._8_8_ = *(undefined8 *)(colors[lVar5].m_data + 2);
      local_118._0_8_ = *(undefined8 *)colors[lVar5].m_data;
      iVar2 = *(int *)((long)&this->m_emitCount->value + lVar5 * 4);
    }
    else if (iVar2 == 0) {
      texColor.m_data._0_8_ = *(undefined8 *)&pVVar1->outputs[0].v;
      texColor.m_data._8_8_ = *(undefined8 *)((long)&pVVar1->outputs[0].v + 8);
      lVar5 = 0;
      if (this->m_instanced != false) {
        lVar5 = lVar3;
      }
      iVar2 = (int)texColor.m_data[lVar5];
      local_118._8_8_ = 0x3f8000003f800000;
      local_118._0_8_ = ~CONCAT44(-(uint)(10 < iVar2),-(uint)(iVar2 < 10)) & DAT_0166f150;
    }
    else {
      local_118._0_12_ = ZEXT812(0);
      local_118._12_4_ = 0;
      iVar2 = 0;
    }
    for (iVar6 = 0; iVar6 < iVar2 / 2; iVar6 = iVar6 + 1) {
      fVar7 = (((float)iVar6 + 0.5) / (float)(iVar2 / 2)) * 3.142;
      if (this->m_instanced == true) {
        fVar8 = cosf(__x);
        position1.m_data[1] = sinf(__x);
        position1.m_data[2] = 0.0;
        position1.m_data[3] = 0.0;
        position1.m_data[0] = fVar8;
        tcu::operator*((tcu *)&position0,0.5,(Vector<float,_4> *)&position1);
        tcu::operator+((tcu *)&texColor,&pVVar1->position,(Vector<float,_4> *)&position0);
      }
      else {
        tcu::Vector<float,_4>::Vector(&texColor,&pVVar1->position);
      }
      fVar8 = cosf(fVar7);
      fStack_104 = sinf(fVar7);
      local_108 = fVar8;
      uStack_100 = 0;
      tcu::operator*((tcu *)&position1,0.15,(Vector<float,_4> *)&local_108);
      tcu::operator+((tcu *)&position0,&texColor,(Vector<float,_4> *)&position1);
      fVar8 = cosf(fVar7);
      local_e8.m_data[1] = sinf(fVar7);
      local_e8.m_data[1] = -local_e8.m_data[1];
      local_e8.m_data[2] = 0.0;
      local_e8.m_data[3] = 0.0;
      local_e8.m_data[0] = fVar8;
      tcu::operator*((tcu *)&local_108,0.15,&local_e8);
      tcu::operator+((tcu *)&position1,&texColor,(Vector<float,_4> *)&local_108);
      _local_108 = local_118._0_8_;
      uStack_100 = local_118._8_8_;
      rr::GeometryEmitter::EmitVertex
                (output,&position0,0.0,(GenericVec4 *)&local_108,packets[uVar4].primitiveIDIn);
      rr::GeometryEmitter::EmitVertex
                (output,&position1,0.0,(GenericVec4 *)&local_108,packets[uVar4].primitiveIDIn);
    }
    rr::GeometryEmitter::EndPrimitive(output);
    uVar4 = local_f0 + 1;
  }
  return;
}

Assistant:

void VaryingOutputCountShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);

	const tcu::Vec4 red			= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 green		= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue		= tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f);
	const tcu::Vec4 yellow		= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 colors[4]	= { red, green, blue, yellow };

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const rr::VertexPacket*	vertex		= packets[packetNdx].vertices[0];
		int						emitCount	= 0;
		tcu::Vec4				color		= tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);

		if (m_test == READ_ATTRIBUTE)
		{
			emitCount = (int)vertex->outputs[0].get<float>()[(m_instanced) ? (invocationID) : (0)];
			color = tcu::Vec4((emitCount < 10) ? (0.0f) : (1.0f), (emitCount > 10) ? (0.0f) : (1.0f), 1.0f, 1.0f);
		}
		else if (m_test == READ_UNIFORM)
		{
			const int primitiveNdx = (m_instanced) ? (invocationID) : ((int)vertex->outputs[0].get<float>().x());

			DE_ASSERT(primitiveNdx >= 0);
			DE_ASSERT(primitiveNdx < 4);

			emitCount = m_emitCount.value.i4[primitiveNdx];
			color = colors[primitiveNdx];
		}
		else if (m_test == READ_TEXTURE)
		{
			const int			primitiveNdx	= (m_instanced) ? (invocationID) : ((int)vertex->outputs[0].get<float>().x());
			const tcu::Vec2		texCoord		= tcu::Vec2(1.0f / 8.0f + (float)primitiveNdx / 4.0f, 0.5f);
			const tcu::Vec4		texColor		= m_sampler.sampler.tex2D->sample(texCoord.x(), texCoord.y(), 0.0f);

			DE_ASSERT(primitiveNdx >= 0);
			DE_ASSERT(primitiveNdx < 4);

			color = colors[primitiveNdx];
			emitCount = 0;

			if (texColor.x() > 0.0f)
				emitCount += (EMIT_COUNT_VERTEX_0 == -1) ? (m_maxEmitCount) : (EMIT_COUNT_VERTEX_0);
			if (texColor.y() > 0.0f)
				emitCount += (EMIT_COUNT_VERTEX_1 == -1) ? (m_maxEmitCount) : (EMIT_COUNT_VERTEX_1);
			if (texColor.z() > 0.0f)
				emitCount += (EMIT_COUNT_VERTEX_2 == -1) ? (m_maxEmitCount) : (EMIT_COUNT_VERTEX_2);
			if (texColor.w() > 0.0f)
				emitCount += (EMIT_COUNT_VERTEX_3 == -1) ? (m_maxEmitCount) : (EMIT_COUNT_VERTEX_3);
		}
		else
			DE_ASSERT(DE_FALSE);

		for (int ndx = 0; ndx < (int)emitCount / 2; ++ndx)
		{
			const float		angle			= (float(ndx) + 0.5f) / float(emitCount / 2) * 3.142f;
			const tcu::Vec4 basePosition	= (m_instanced) ?
												(vertex->position + tcu::Vec4(deFloatCos(float(invocationID)), deFloatSin(float(invocationID)), 0.0f, 0.0f) * 0.5f) :
												(vertex->position);
			const tcu::Vec4	position0		= basePosition + tcu::Vec4(deFloatCos(angle),  deFloatSin(angle), 0.0f, 0.0f) * 0.15f;
			const tcu::Vec4	position1		= basePosition + tcu::Vec4(deFloatCos(angle), -deFloatSin(angle), 0.0f, 0.0f) * 0.15f;
			rr::GenericVec4	fragColor;

			fragColor = color;

			output.EmitVertex(position0, 0.0f, &fragColor, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(position1, 0.0f, &fragColor, packets[packetNdx].primitiveIDIn);
		}

		output.EndPrimitive();
	}
}